

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cc
# Opt level: O2

Texture * __thiscall SDL2pp::Texture::Update(Texture *this,Optional<Rect> *rect,Surface *surface)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Uint32 UVar4;
  Uint32 UVar5;
  int iVar6;
  value_type *pvVar7;
  void *pvVar8;
  LockHandle lock_1;
  LockHandle lock;
  int local_64;
  undefined1 local_60 [12];
  Optional<Rect> local_54;
  Surface local_40;
  
  if ((rect->super___optional_storage<SDL2pp::Rect,_true>).__engaged_ == true) {
    pvVar7 = sdl2pp_libcpp_optional::optional<SDL2pp::Rect>::operator*(rect);
    iVar6 = (pvVar7->super_SDL_Rect).x;
    local_64 = (pvVar7->super_SDL_Rect).y;
    iVar1 = (pvVar7->super_SDL_Rect).w;
    iVar2 = (pvVar7->super_SDL_Rect).h;
  }
  else {
    iVar1 = GetWidth(this);
    iVar2 = GetHeight(this);
    local_64 = 0;
    iVar6 = 0;
  }
  iVar3 = Surface::GetWidth(surface);
  if (iVar3 < iVar1) {
    iVar1 = iVar3;
  }
  iVar3 = Surface::GetHeight(surface);
  if (iVar3 < iVar2) {
    iVar2 = iVar3;
  }
  UVar4 = GetFormat(this);
  UVar5 = Surface::GetFormat(surface);
  local_54.super___optional_storage<SDL2pp::Rect,_true>.field_0.__val_.super_SDL_Rect.x = iVar6;
  local_54.super___optional_storage<SDL2pp::Rect,_true>.field_0.__val_.super_SDL_Rect.w = iVar1;
  local_54.super___optional_storage<SDL2pp::Rect,_true>.field_0.__val_.super_SDL_Rect.h = iVar2;
  if (UVar4 == UVar5) {
    Surface::Lock(&local_40);
    local_54.super___optional_storage<SDL2pp::Rect,_true>.field_0.__val_.super_SDL_Rect.y = local_64
    ;
    local_54.super___optional_storage<SDL2pp::Rect,_true>.__engaged_ = true;
    pvVar8 = Surface::LockHandle::GetPixels((LockHandle *)&local_40);
    iVar6 = Surface::LockHandle::GetPitch((LockHandle *)&local_40);
    Update(this,&local_54,pvVar8,iVar6);
    Surface::LockHandle::~LockHandle((LockHandle *)&local_40);
  }
  else {
    GetFormat(this);
    Surface::Convert(&local_40,(Uint32)surface);
    Surface::Lock((Surface *)local_60);
    local_54.super___optional_storage<SDL2pp::Rect,_true>.field_0.__val_.super_SDL_Rect.y = local_64
    ;
    local_54.super___optional_storage<SDL2pp::Rect,_true>.__engaged_ = true;
    pvVar8 = Surface::LockHandle::GetPixels((LockHandle *)local_60);
    iVar6 = Surface::LockHandle::GetPitch((LockHandle *)local_60);
    Update(this,&local_54,pvVar8,iVar6);
    Surface::LockHandle::~LockHandle((LockHandle *)local_60);
    Surface::~Surface(&local_40);
  }
  return this;
}

Assistant:

Texture& Texture::Update(const Optional<Rect>& rect, Surface& surface) {
	Rect real_rect = rect ? *rect : Rect(0, 0, GetWidth(), GetHeight());

	real_rect.w = std::min(real_rect.w, surface.GetWidth());
	real_rect.h = std::min(real_rect.h, surface.GetHeight());

	if (GetFormat() == surface.GetFormat()) {
		Surface::LockHandle lock = surface.Lock();

		return Update(real_rect, lock.GetPixels(), lock.GetPitch());
	} else {
		Surface converted = surface.Convert(GetFormat());
		Surface::LockHandle lock = converted.Lock();

		return Update(real_rect, lock.GetPixels(), lock.GetPitch());
	}
}